

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O2

Result RunSpecificExports(Ptr *instance,Errors *errors,
                         vector<FunctionCall,_std::allocator<FunctionCall>_> *calls)

{
  pointer *__rhs;
  pointer pEVar1;
  pointer pFVar2;
  __type _Var3;
  Result RVar4;
  FuncType *pFVar5;
  ExternType *base;
  pointer __lhs;
  FuncType *func_type;
  string_view name;
  Ptr *in_stack_ffffffffffffff40;
  Enum local_b4;
  Ptr trap;
  Values results;
  RefPtr<wabt::interp::Func> func;
  RefPtr<wabt::interp::Module> module;
  
  wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
            (&module,&s_store,(Ref)(instance->obj_->module_).index);
  __lhs = ((module.obj_)->desc_).exports.
          super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
          _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = ((module.obj_)->desc_).exports.
           super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_b4 = Ok;
  do {
    if (__lhs == pEVar1) {
      wabt::interp::RefPtr<wabt::interp::Module>::reset(&module);
      return (Result)local_b4;
    }
    pFVar2 = (calls->super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    func_type = (FuncType *)
                &((calls->super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>)._M_impl.
                  super__Vector_impl_data._M_start)->args;
    while (__rhs = &func_type[-1].params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage, (pointer)__rhs != pFVar2) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__rhs);
      if (_Var3) {
        base = (__lhs->type).type._M_t.
               super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
               .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
        if (base->kind != First) {
          printf("Export \'%s\' is not a function\n",(__lhs->type).name._M_dataplus._M_p);
LAB_0010ea9d:
          exit(1);
        }
        if (s_trace_stream != (Stream *)0x0) {
          wabt::Stream::Writef(s_trace_stream,">>> running export \"%s\":\n",*__rhs);
          base = (__lhs->type).type._M_t.
                 super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                 .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
        }
        pFVar5 = wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>(base);
        if ((int)((ulong)((long)(pFVar5->params).
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pFVar5->params).
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3) !=
            (int)((ulong)(*(long *)&(func_type->super_ExternType).kind -
                         (long)(func_type->super_ExternType)._vptr_ExternType) >> 4)) {
          printf("Exported function \'%s\' expects %d arguments, but %d were provided\n",
                 (__lhs->type).name._M_dataplus._M_p);
          goto LAB_0010ea9d;
        }
        wabt::interp::RefPtr<wabt::interp::Func>::RefPtr
                  (&func,&s_store,
                   (Ref)(instance->obj_->funcs_).
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start[__lhs->index].index);
        results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        trap.root_index_ = 0;
        results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        trap.obj_ = (Trap *)0x0;
        trap.store_ = (Store *)0x0;
        RVar4 = wabt::interp::Func::Call
                          (func.obj_,&s_store,(Values *)func_type,
                           (Values *)
                           &results.
                            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                           ,&trap,s_trace_stream);
        local_b4 = (Enum)(RVar4.enum_ == Error || local_b4 == Error);
        name._M_str = (char *)pFVar5;
        name._M_len = (size_t)(__lhs->type).name._M_dataplus._M_p;
        wabt::interp::WriteCall
                  ((interp *)
                   s_stdout_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                   (Stream *)(__lhs->type).name._M_string_length,name,func_type,
                   (Values *)
                   &results.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>,
                   (Values *)&trap,in_stack_ffffffffffffff40);
        wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
        std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                  (&results.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>);
        wabt::interp::RefPtr<wabt::interp::Func>::reset(&func);
      }
      func_type = (FuncType *)
                  &(func_type->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

Result RunSpecificExports(const Instance::Ptr& instance,
                          Errors* errors,
                          std::vector<FunctionCall>& calls) {
  Result result = Result::Ok;

  auto module = s_store.UnsafeGet<Module>(instance->module());
  auto&& module_desc = module->desc();

  for (auto&& export_ : module_desc.exports) {
    for (auto& call_ : calls) {
      if (export_.type.name == call_.name) {
        ERROR_EXIT_UNLESS(export_.type.type->kind == ExternalKind::Func,
                          "Export '%s' is not a function\n",
                          export_.type.name.c_str());

        if (s_trace_stream) {
          s_trace_stream->Writef(">>> running export \"%s\":\n",
                                 call_.name.c_str());
        }
        auto* func_type = cast<FuncType>(export_.type.type.get());
        int params_size = func_type->params.size();
        int args_size = call_.args.size();
        ERROR_EXIT_UNLESS(params_size == args_size,
                          "Exported function '%s' expects %d arguments, but %d "
                          "were provided\n",
                          export_.type.name.c_str(), params_size, args_size);

        auto func = s_store.UnsafeGet<Func>(instance->funcs()[export_.index]);
        Values results;
        Trap::Ptr trap;
        result |=
            func->Call(s_store, call_.args, results, &trap, s_trace_stream);
        WriteCall(s_stdout_stream.get(), export_.type.name, *func_type,
                  call_.args, results, trap);
      }
    }
  }

  return result;
}